

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_between.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundBetweenExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  DataChunk *this_00;
  LogicalType *type;
  reference pvVar1;
  type pEVar2;
  reference pvVar3;
  idx_t iVar4;
  InvalidTypeException *pIVar5;
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  *this_01;
  Vector input;
  Vector upper;
  Vector lower;
  Vector local_188;
  Vector local_120;
  Vector local_b8;
  string local_50;
  
  this_00 = &state->intermediate_chunk;
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  Vector::Vector(&local_188,pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&this_00->data,1);
  Vector::Vector(&local_b8,pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&this_00->data,2);
  Vector::Vector(&local_120,pvVar1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->input);
  this_01 = &state->child_states;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,0);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&local_188
         );
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->lower);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,1);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&local_b8)
  ;
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->upper);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,2);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&local_120
         );
  if ((expr->upper_inclusive == true) && (expr->lower_inclusive == true)) {
    if (local_188.type.physical_type_ < VARCHAR) {
      switch(local_188.type.physical_type_) {
      case BOOL:
      case INT8:
        iVar4 = TernaryExecutor::
                Select<signed_char,signed_char,signed_char,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT8:
        iVar4 = TernaryExecutor::
                Select<unsigned_char,unsigned_char,unsigned_char,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT16:
        iVar4 = TernaryExecutor::
                Select<unsigned_short,unsigned_short,unsigned_short,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT16:
        iVar4 = TernaryExecutor::Select<short,short,short,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT32:
        iVar4 = TernaryExecutor::
                Select<unsigned_int,unsigned_int,unsigned_int,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT32:
        iVar4 = TernaryExecutor::Select<int,int,int,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT64:
        iVar4 = TernaryExecutor::
                Select<unsigned_long,unsigned_long,unsigned_long,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT64:
        iVar4 = TernaryExecutor::Select<long,long,long,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      default:
switchD_00eb5f18_caseD_a:
        pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid type for BETWEEN","");
        InvalidTypeException::InvalidTypeException(pIVar5,&local_188.type,&local_50);
        __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar4 = TernaryExecutor::Select<float,float,float,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case DOUBLE:
        iVar4 = TernaryExecutor::Select<double,double,double,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INTERVAL:
        iVar4 = TernaryExecutor::
                Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BothInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
    }
    else if (local_188.type.physical_type_ == VARCHAR) {
      iVar4 = TernaryExecutor::
              Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BothInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
    else if (local_188.type.physical_type_ == UINT128) {
      iVar4 = TernaryExecutor::
              Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BothInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
    else {
      if (local_188.type.physical_type_ != INT128) goto switchD_00eb5f18_caseD_a;
      iVar4 = TernaryExecutor::
              Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BothInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
  }
  else {
    type = &local_188.type;
    if (expr->lower_inclusive == true) {
      if (local_188.type.physical_type_ < VARCHAR) {
        switch(local_188.type.physical_type_) {
        case BOOL:
        case INT8:
          iVar4 = TernaryExecutor::
                  Select<signed_char,signed_char,signed_char,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT8:
          iVar4 = TernaryExecutor::
                  Select<unsigned_char,unsigned_char,unsigned_char,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT16:
          iVar4 = TernaryExecutor::
                  Select<unsigned_short,unsigned_short,unsigned_short,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT16:
          iVar4 = TernaryExecutor::Select<short,short,short,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT32:
          iVar4 = TernaryExecutor::
                  Select<unsigned_int,unsigned_int,unsigned_int,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT32:
          iVar4 = TernaryExecutor::Select<int,int,int,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT64:
          iVar4 = TernaryExecutor::
                  Select<unsigned_long,unsigned_long,unsigned_long,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT64:
          iVar4 = TernaryExecutor::Select<long,long,long,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        default:
switchD_00eb5f7c_caseD_a:
          pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Invalid type for BETWEEN","");
          InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
          __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
        case FLOAT:
          iVar4 = TernaryExecutor::Select<float,float,float,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case DOUBLE:
          iVar4 = TernaryExecutor::
                  Select<double,double,double,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INTERVAL:
          iVar4 = TernaryExecutor::
                  Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        }
      }
      else if (local_188.type.physical_type_ == VARCHAR) {
        iVar4 = TernaryExecutor::
                Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::LowerInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
      else if (local_188.type.physical_type_ == UINT128) {
        iVar4 = TernaryExecutor::
                Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::LowerInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
      else {
        if (local_188.type.physical_type_ != INT128) goto switchD_00eb5f7c_caseD_a;
        iVar4 = TernaryExecutor::
                Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::LowerInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
    }
    else if (expr->upper_inclusive == false) {
      if (local_188.type.physical_type_ < VARCHAR) {
        switch(local_188.type.physical_type_) {
        case BOOL:
        case INT8:
          iVar4 = TernaryExecutor::
                  Select<signed_char,signed_char,signed_char,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT8:
          iVar4 = TernaryExecutor::
                  Select<unsigned_char,unsigned_char,unsigned_char,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT16:
          iVar4 = TernaryExecutor::
                  Select<unsigned_short,unsigned_short,unsigned_short,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT16:
          iVar4 = TernaryExecutor::Select<short,short,short,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT32:
          iVar4 = TernaryExecutor::
                  Select<unsigned_int,unsigned_int,unsigned_int,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT32:
          iVar4 = TernaryExecutor::Select<int,int,int,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case UINT64:
          iVar4 = TernaryExecutor::
                  Select<unsigned_long,unsigned_long,unsigned_long,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INT64:
          iVar4 = TernaryExecutor::Select<long,long,long,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        default:
switchD_00eb6024_caseD_a:
          pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Invalid type for BETWEEN","");
          InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
          __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
        case FLOAT:
          iVar4 = TernaryExecutor::Select<float,float,float,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case DOUBLE:
          iVar4 = TernaryExecutor::Select<double,double,double,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
          break;
        case INTERVAL:
          iVar4 = TernaryExecutor::
                  Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::ExclusiveBetweenOperator>
                            (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        }
      }
      else if (local_188.type.physical_type_ == VARCHAR) {
        iVar4 = TernaryExecutor::
                Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::ExclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
      else if (local_188.type.physical_type_ == UINT128) {
        iVar4 = TernaryExecutor::
                Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::ExclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
      else {
        if (local_188.type.physical_type_ != INT128) goto switchD_00eb6024_caseD_a;
        iVar4 = TernaryExecutor::
                Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ExclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
    }
    else if (local_188.type.physical_type_ < VARCHAR) {
      switch(local_188.type.physical_type_) {
      case BOOL:
      case INT8:
        iVar4 = TernaryExecutor::
                Select<signed_char,signed_char,signed_char,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT8:
        iVar4 = TernaryExecutor::
                Select<unsigned_char,unsigned_char,unsigned_char,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT16:
        iVar4 = TernaryExecutor::
                Select<unsigned_short,unsigned_short,unsigned_short,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT16:
        iVar4 = TernaryExecutor::Select<short,short,short,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT32:
        iVar4 = TernaryExecutor::
                Select<unsigned_int,unsigned_int,unsigned_int,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT32:
        iVar4 = TernaryExecutor::Select<int,int,int,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case UINT64:
        iVar4 = TernaryExecutor::
                Select<unsigned_long,unsigned_long,unsigned_long,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INT64:
        iVar4 = TernaryExecutor::Select<long,long,long,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      default:
switchD_00eb5fd2_caseD_a:
        pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid type for BETWEEN","");
        InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
        __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar4 = TernaryExecutor::Select<float,float,float,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case DOUBLE:
        iVar4 = TernaryExecutor::Select<double,double,double,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
        break;
      case INTERVAL:
        iVar4 = TernaryExecutor::
                Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator>
                          (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
      }
    }
    else if (local_188.type.physical_type_ == VARCHAR) {
      iVar4 = TernaryExecutor::
              Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::UpperInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
    else if (local_188.type.physical_type_ == UINT128) {
      iVar4 = TernaryExecutor::
              Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UpperInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
    else {
      if (local_188.type.physical_type_ != INT128) goto switchD_00eb5fd2_caseD_a;
      iVar4 = TernaryExecutor::
              Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UpperInclusiveBetweenOperator>
                        (&local_188,&local_b8,&local_120,sel,count,true_sel,false_sel);
    }
  }
  if (local_120.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_120.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_120.type);
  if (local_b8.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_b8.type);
  if (local_188.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_188.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_188.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_188.type);
  return iVar4;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundBetweenExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifdef DUCKDB_SMALLER_BINARY
	throw InternalException("ExpressionExecutor::Select not available with DUCKDB_SMALLER_BINARY");
#else
	// resolve the children
	Vector input(state->intermediate_chunk.data[0]);
	Vector lower(state->intermediate_chunk.data[1]);
	Vector upper(state->intermediate_chunk.data[2]);

	Execute(*expr.input, state->child_states[0].get(), sel, count, input);
	Execute(*expr.lower, state->child_states[1].get(), sel, count, lower);
	Execute(*expr.upper, state->child_states[2].get(), sel, count, upper);

	if (expr.upper_inclusive && expr.lower_inclusive) {
		return BetweenLoopTypeSwitch<BothInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                           false_sel);
	} else if (expr.lower_inclusive) {
		return BetweenLoopTypeSwitch<LowerInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                            false_sel);
	} else if (expr.upper_inclusive) {
		return BetweenLoopTypeSwitch<UpperInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                            false_sel);
	} else {
		return BetweenLoopTypeSwitch<ExclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel, false_sel);
	}
#endif
}